

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O0

char * __thiscall Memory::HeapAllocator::AllocT<true>(HeapAllocator *this,size_t byteSize)

{
  unsigned_long uVar1;
  size_t __size;
  HANDLE hHeap;
  HeapAllocRecord *local_50;
  char *buffer;
  TrackAllocData allocData;
  size_t requestedBytes;
  size_t byteSize_local;
  HeapAllocator *this_local;
  
  allocData._32_8_ = byteSize;
  uVar1 = Math::Align<unsigned_long>(0x58,8);
  __size = AllocSizeMath::Add(byteSize,uVar1);
  ClearTrackAllocInfo(this,(TrackAllocData *)&buffer);
  if ((Js::Configuration::Global[0x11add] & 1) == 0) {
    local_50 = (HeapAllocRecord *)malloc(__size);
  }
  else {
    hHeap = GetPrivateHeap(this);
    local_50 = (HeapAllocRecord *)HeapAlloc(hHeap,0,__size);
  }
  if (local_50 != (HeapAllocRecord *)0x0) {
    CCLock::Enter(&cs.super_CCLock);
    HeapAllocatorData::LogAlloc(&this->data,local_50,allocData._32_8_,(TrackAllocData *)&buffer);
    CCLock::Leave(&cs.super_CCLock);
    uVar1 = Math::Align<unsigned_long>(0x58,8);
    local_50 = (HeapAllocRecord *)((long)&local_50->prev + uVar1);
  }
  return (char *)local_50;
}

Assistant:

char * HeapAllocator::AllocT(size_t byteSize)
{
#ifdef HEAP_TRACK_ALLOC
    size_t requestedBytes = byteSize;
    byteSize = AllocSizeMath::Add(requestedBytes, ::Math::Align<size_t>(sizeof(HeapAllocRecord), MEMORY_ALLOCATION_ALIGNMENT));
    TrackAllocData allocData;
    ClearTrackAllocInfo(&allocData);
#elif defined(HEAP_PERF_COUNTERS)
    size_t requestedBytes = byteSize;
    byteSize = AllocSizeMath::Add(requestedBytes, ::Math::Align<size_t>(sizeof(size_t), MEMORY_ALLOCATION_ALIGNMENT));
#endif

    if (noThrow)
    {
        FAULTINJECT_MEMORY_NOTHROW(_u("Heap"), byteSize);
    }
    else
    {
        FAULTINJECT_MEMORY_THROW(_u("Heap"), byteSize);
    }

    char * buffer;
#ifdef INTERNAL_MEM_PROTECT_HEAP_ALLOC
    if (DoUseMemProtectHeap())
    {
        void * memory = MemProtectHeapRootAlloc(memProtectHeapHandle, byteSize);
        if (memory == nullptr)
        {
            if (noThrow)
            {
                return nullptr;
            }
            Js::Throw::OutOfMemory();
        }
        buffer = (char *)memory;
    }
    else
#endif
    {
        if (CONFIG_FLAG(PrivateHeap))
        {
            buffer = (char *)HeapAlloc(GetPrivateHeap(), 0, byteSize);
        }
        else
        {
            buffer = (char *)malloc(byteSize);
        }
    }

    if (!noThrow && buffer == nullptr)
    {
        Js::Throw::OutOfMemory();
    }

#if defined(HEAP_TRACK_ALLOC) || defined(HEAP_PERF_COUNTERS)
    if (!noThrow || buffer != nullptr)
    {
#ifdef HEAP_TRACK_ALLOC
        cs.Enter();
        data.LogAlloc((HeapAllocRecord *)buffer, requestedBytes, allocData);
        cs.Leave();
        buffer += ::Math::Align<size_t>(sizeof(HeapAllocRecord), MEMORY_ALLOCATION_ALIGNMENT);
#else
        *(size_t *)buffer = requestedBytes;
        buffer += ::Math::Align<size_t>(sizeof(size_t), MEMORY_ALLOCATION_ALIGNMENT);

#endif
        HEAP_PERF_COUNTER_INC(LiveObject);
        HEAP_PERF_COUNTER_ADD(LiveObjectSize, requestedBytes);
    }
#endif
    return buffer;
}